

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t icu_63::spanOneUTF8(UnicodeSet *set,uint8_t *s,int32_t length)

{
  UBool UVar1;
  uint uVar2;
  uint c;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  
  bVar5 = *s;
  uVar2 = (uint)bVar5;
  if (-1 < (char)bVar5) {
    UVar1 = UnicodeSet::contains(set,uVar2);
    return -(uint)(UVar1 == '\0') | 1;
  }
  uVar4 = 1;
  uVar3 = 1;
  c = 0xfffd;
  if (length == 1) goto LAB_002ace7f;
  if (bVar5 < 0xe0) {
    if (bVar5 < 0xc2) goto LAB_002ace7f;
    uVar2 = uVar2 & 0x1f;
  }
  else {
    if (bVar5 < 0xf0) {
      uVar2 = uVar2 & 0xf;
      if (((byte)" 000000000000\x1000"[uVar2] >> (s[1] >> 5) & 1) == 0) goto LAB_002ace7f;
      bVar5 = s[1] & 0x3f;
      uVar4 = 2;
    }
    else {
      if (0xf4 < bVar5) goto LAB_002ace7f;
      if (((((uint)(int)""[s[1] >> 4] >> (uVar2 - 0xf0 & 0x1f) & 1) == 0) ||
          (uVar3 = 2, length == 2)) || (bVar5 = s[2] + 0x80, 0x3f < bVar5)) goto LAB_002ace7f;
      uVar2 = s[1] & 0x3f | (uVar2 - 0xf0) * 0x40;
      uVar4 = 3;
    }
    uVar3 = length;
    if (uVar4 == length) goto LAB_002ace7f;
    uVar2 = (uint)bVar5 | uVar2 << 6;
  }
  uVar3 = uVar4;
  if ((byte)(s[uVar4] ^ 0x80) < 0x40) {
    c = uVar2 << 6 | s[uVar4] ^ 0x80;
    uVar3 = uVar4 + 1;
  }
LAB_002ace7f:
  UVar1 = UnicodeSet::contains(set,c);
  uVar2 = -uVar3;
  if (UVar1 != '\0') {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

static inline int32_t
spanOneUTF8(const UnicodeSet &set, const uint8_t *s, int32_t length) {
    UChar32 c=*s;
    if(U8_IS_SINGLE(c)) {
        return set.contains(c) ? 1 : -1;
    }
    // Take advantage of non-ASCII fastpaths in U8_NEXT_OR_FFFD().
    int32_t i=0;
    U8_NEXT_OR_FFFD(s, i, length, c);
    return set.contains(c) ? i : -i;
}